

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O1

void __thiscall tls_functor::operator()(tls_functor *this)

{
  int iVar1;
  thread_specific_ptr<tls_object> *this_00;
  long lVar2;
  tls_object *new_val;
  ostream *poVar3;
  runtime_error *prVar4;
  int iVar5;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  this_00 = this->ptr;
  lVar2 = (**(code **)(*(long *)*this_00 + 0x10))();
  if (*(long *)(lVar2 + 8) == 0) {
    new_val = (tls_object *)operator_new(4);
    new_val->counter = 0;
    booster::thread_specific_ptr<tls_object>::reset(this_00,new_val);
  }
  iVar5 = 0;
  do {
    if (iVar5 == 10) {
      lVar2 = (**(code **)(*(long *)*this_00 + 0x10))();
      if (**(int **)(lVar2 + 8) == 10) {
        return;
      }
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," p->counter == 10",0x11);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,local_1b0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar2 = (**(code **)(*(long *)*this_00 + 0x10))();
    iVar1 = **(int **)(lVar2 + 8);
    booster::ptime::millisleep(0x19);
    lVar2 = (**(code **)(*(long *)*this_00 + 0x10))();
    **(int **)(lVar2 + 8) = iVar1 + 1;
    lVar2 = (**(code **)(*(long *)*this_00 + 0x10))();
    iVar5 = iVar5 + 1;
  } while (iVar5 == **(int **)(lVar2 + 8));
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
             ,0x70);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x69);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," p->counter == i+1",0x12);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,local_1b0);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void operator()() const
	{
		try {
			booster::thread_specific_ptr<tls_object> &p=*ptr;
			if(p.get()==0)
				p.reset(new tls_object());
			for(int i=0;i<10;i++) {
				int v1 = p->counter;
				booster::ptime::millisleep(25);
				p->counter = v1+1;
				TEST(p->counter == i+1);
			}
			TEST(p->counter == 10);
		}
		catch(...) {
			tls_ok=false;
		}
	}